

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatSkill.cpp
# Opt level: O3

void Handlers::StatSkill_Add(Character *character,PacketReader *reader)

{
  char *pcVar1;
  World *pWVar2;
  uchar uVar3;
  bool bVar4;
  unsigned_short spell;
  short sVar5;
  int iVar6;
  int iVar7;
  mapped_type *pmVar8;
  ushort uVar9;
  _List_node_base *p_Var10;
  PacketBuilder reply;
  PacketBuilder local_80;
  key_type local_50;
  
  uVar3 = PacketReader::GetChar(reader);
  spell = PacketReader::GetShort(reader);
  PacketBuilder::PacketBuilder(&local_80,PACKET_F_INIT,PACKET_A_INIT,0);
  if (uVar3 == '\x02') {
    if (0 < character->skillpoints) {
      bVar4 = Character::HasSpell(character,spell);
      if (bVar4) {
        sVar5 = Character::SpellLevel(character,spell);
        pWVar2 = character->world;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"MaxSkillLevel","");
        pmVar8 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&pWVar2->config,&local_50);
        iVar7 = util::variant::GetInt(pmVar8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (sVar5 < iVar7) {
          p_Var10 = (character->spells).
                    super__List_base<Character_Spell,_std::allocator<Character_Spell>_>._M_impl.
                    _M_node.super__List_node_base._M_next;
          if (p_Var10 != (_List_node_base *)&character->spells) {
            do {
              if ((int)*(short *)&p_Var10[1]._M_next == (uint)spell) {
                pcVar1 = (char *)((long)&p_Var10[1]._M_next + 2);
                *pcVar1 = *pcVar1 + '\x01';
                character->skillpoints = character->skillpoints + -1;
                PacketBuilder::SetID(&local_80,PACKET_STATSKILL,PACKET_ACCEPT);
                PacketBuilder::ReserveMore(&local_80,6);
                PacketBuilder::AddShort(&local_80,character->skillpoints);
                PacketBuilder::AddShort(&local_80,(uint)spell);
                PacketBuilder::AddShort(&local_80,(uint)*(byte *)((long)&p_Var10[1]._M_next + 2));
                Character::Send(character,&local_80);
              }
              p_Var10 = p_Var10->_M_next;
            } while (p_Var10 != (_List_node_base *)&character->spells);
          }
        }
      }
    }
  }
  else if (((uVar3 == '\x01') && (0 < character->statpoints)) && (uVar9 = spell - 1, uVar9 < 6)) {
    iVar7 = (&character->str)[uVar9];
    pWVar2 = character->world;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"MaxStat","");
    pmVar8 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&pWVar2->config,&local_50);
    iVar6 = util::variant::GetInt(pmVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (iVar7 < iVar6) {
      (&character->str)[uVar9] = (&character->str)[uVar9] + 1;
      character->statpoints = character->statpoints + -1;
      Character::CalculateStats(character,true);
      PacketBuilder::SetID(&local_80,PACKET_STATSKILL,PACKET_PLAYER);
      PacketBuilder::ReserveMore(&local_80,0x20);
      PacketBuilder::AddShort(&local_80,character->statpoints);
      PacketBuilder::AddShort(&local_80,*character->display_str);
      PacketBuilder::AddShort(&local_80,*character->display_intl);
      PacketBuilder::AddShort(&local_80,*character->display_wis);
      PacketBuilder::AddShort(&local_80,*character->display_agi);
      PacketBuilder::AddShort(&local_80,*character->display_con);
      PacketBuilder::AddShort(&local_80,*character->display_cha);
      PacketBuilder::AddShort(&local_80,character->maxhp);
      PacketBuilder::AddShort(&local_80,character->maxtp);
      PacketBuilder::AddShort(&local_80,character->maxsp);
      PacketBuilder::AddShort(&local_80,character->maxweight);
      PacketBuilder::AddShort(&local_80,character->mindam);
      PacketBuilder::AddShort(&local_80,character->maxdam);
      PacketBuilder::AddShort(&local_80,character->accuracy);
      PacketBuilder::AddShort(&local_80,character->evade);
      PacketBuilder::AddShort(&local_80,character->armor);
      Character::Send(character,&local_80);
    }
  }
  PacketBuilder::~PacketBuilder(&local_80);
  return;
}

Assistant:

void StatSkill_Add(Character *character, PacketReader &reader)
{
	int *stat;
	TrainType action = TrainType(reader.GetChar());
	int stat_id = reader.GetShort();

	PacketBuilder reply;

	switch (action)
	{
		case TRAIN_STAT:
			if (character->statpoints <= 0)
				return;

			switch (stat_id)
			{
				case 1: stat = &character->str; break;
				case 2: stat = &character->intl; break;
				case 3: stat = &character->wis; break;
				case 4: stat = &character->agi; break;
				case 5: stat = &character->con; break;
				case 6: stat = &character->cha; break;
				default: return;
			}

			if (*stat >= int(character->world->config["MaxStat"]))
				return;

			++(*stat);
			--character->statpoints;

			character->CalculateStats();

			reply.SetID(PACKET_STATSKILL, PACKET_PLAYER);
			reply.ReserveMore(32);
			reply.AddShort(character->statpoints);
			reply.AddShort(character->display_str);
			reply.AddShort(character->display_intl);
			reply.AddShort(character->display_wis);
			reply.AddShort(character->display_agi);
			reply.AddShort(character->display_con);
			reply.AddShort(character->display_cha);
			reply.AddShort(character->maxhp);
			reply.AddShort(character->maxtp);
			reply.AddShort(character->maxsp);
			reply.AddShort(character->maxweight);
			reply.AddShort(character->mindam);
			reply.AddShort(character->maxdam);
			reply.AddShort(character->accuracy);
			reply.AddShort(character->evade);
			reply.AddShort(character->armor);

			character->Send(reply);

			break;

		case TRAIN_SKILL:
			if (character->skillpoints <= 0 || !character->HasSpell(stat_id)
			 || character->SpellLevel(stat_id) >= int(character->world->config["MaxSkillLevel"]))
			{
				return;
			}

			UTIL_IFOREACH(character->spells, spell)
			{
				if (spell->id == stat_id)
				{
					++spell->level;
					--character->skillpoints;

					reply.SetID(PACKET_STATSKILL, PACKET_ACCEPT);
					reply.ReserveMore(6);
					reply.AddShort(character->skillpoints);
					reply.AddShort(stat_id);
					reply.AddShort(spell->level);
					character->Send(reply);
				}
			}

			break;
	}
}